

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O2

void __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5>::
set_display_type(ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5> *this,
                DisplayType display_type)

{
  undefined1 local_20 [16];
  
  JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>
  ::operator->((JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>
                *)local_20);
  Outputs::CRT::CRT::set_display_type((CRT *)(local_20._8_8_ + 8),display_type);
  std::
  unique_ptr<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  ::~unique_ptr((unique_ptr<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                 *)local_20);
  return;
}

Assistant:

void set_display_type(Outputs::Display::DisplayType display_type) override {
			video_->set_display_type(display_type);
		}